

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

int lmder(custom_funcmult *funcmult,custom_jacobian *jacobian,double *x,int M,int N,double *fvec,
         double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
         double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *x_00;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  byte bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double *in_stack_fffffffffffffe48;
  double local_98;
  double par;
  double *local_88;
  double *local_80;
  double local_78;
  undefined8 uStack_70;
  int local_68;
  uint local_64;
  double *local_60;
  double *local_58;
  double local_50;
  double *local_48;
  double *local_40;
  char local_31;
  
  sVar1 = (long)N * 8;
  local_80 = x;
  local_60 = (double *)malloc(sVar1);
  local_58 = (double *)malloc(sVar1);
  x_00 = (double *)malloc(sVar1);
  lVar5 = (long)M;
  local_88 = (double *)malloc(lVar5 * 8);
  pdVar7 = local_80;
  uVar16 = 0;
  uVar8 = 0;
  *nfev = 0;
  *njev = 0;
  if ((((0 < N) && (N <= M)) && (M <= ldfjac)) &&
     (((uVar16 = uVar8, 0.0 <= ftol && (0.0 <= xtol)) &&
      ((0.0 < factor && ((0 < maxfev && (0.0 <= gtol)))))))) {
    local_48 = (double *)(ulong)(uint)N;
    if (0 < N && mode == 2) {
      pdVar9 = (double *)0x0;
      do {
        if (diag[(long)pdVar9] <= 0.0) {
          return 0;
        }
        pdVar9 = (double *)((long)pdVar9 + 1);
      } while (local_48 != pdVar9);
    }
    local_64 = M;
    local_40 = (double *)(ulong)(uint)N;
    (*funcmult->funcmult)(local_80,M,N,fvec,funcmult->params);
    *nfev = 1;
    dVar19 = enorm(fvec,M);
    pdVar9 = local_48;
    local_98 = 0.0;
    iVar4 = (int)local_40 + 1;
    sVar1 = (ulong)(uint)M * 8;
    local_31 = (int)local_40 < 1 || mode == 2;
    local_68 = 1;
    do {
      pdVar6 = fjac;
      (*jacobian->jacobian)(pdVar7,local_64,(int)local_40,fjac,jacobian->params);
      uVar16 = local_64;
      *njev = *njev + 1;
      pdVar13 = (double *)(ulong)local_64;
      qrfac(fjac,local_64,(int)local_40,(int)pdVar6,1,ipvt,(int)in_stack_fffffffffffffe48,local_60,
            local_58,eps);
      if (local_68 == 1) {
        if (local_31 == '\0') {
          pdVar6 = (double *)0x0;
          do {
            uVar18 = -(ulong)(local_58[(long)pdVar6] == 0.0);
            diag[(long)pdVar6] =
                 (double)(uVar18 & 0x3ff0000000000000 | ~uVar18 & (ulong)local_58[(long)pdVar6]);
            pdVar6 = (double *)((long)pdVar6 + 1);
          } while (local_48 != pdVar6);
        }
        if (0 < (int)local_40) {
          pdVar6 = (double *)0x0;
          do {
            x_00[(long)pdVar6] = diag[(long)pdVar6] * pdVar7[(long)pdVar6];
            pdVar6 = (double *)((long)pdVar6 + 1);
          } while (local_48 != pdVar6);
        }
        pdVar13 = local_40;
        par = enorm(x_00,(int)local_40);
        local_50 = par * factor;
        if ((local_50 == 0.0) && (!NAN(local_50))) {
          local_50 = factor;
        }
      }
      pdVar7 = local_88;
      if (0 < (int)uVar16) {
        pdVar13 = fvec;
        memcpy(local_88,fvec,sVar1);
      }
      if (0 < (int)local_40) {
        pdVar13 = (double *)0x0;
        uVar18 = (ulong)(uint)M;
        pdVar6 = pdVar7;
        pdVar11 = fjac;
        do {
          iVar14 = iVar4 * (int)pdVar13;
          dVar25 = fjac[iVar14];
          if ((dVar25 != 0.0) || (NAN(dVar25))) {
            dVar24 = 0.0;
            if ((long)pdVar13 < lVar5) {
              uVar15 = 0;
              pdVar12 = pdVar11;
              do {
                dVar24 = dVar24 + *pdVar12 * pdVar6[uVar15];
                pdVar12 = pdVar12 + (long)pdVar9;
                uVar15 = uVar15 + 1;
              } while (uVar18 != uVar15);
            }
            local_78 = -dVar24 / dVar25;
            uStack_70 = 0x8000000000000000;
            if ((long)pdVar13 < lVar5) {
              uVar15 = 0;
              pdVar12 = pdVar11;
              do {
                pdVar6[uVar15] = *pdVar12 * local_78 + pdVar6[uVar15];
                pdVar12 = pdVar12 + (long)pdVar9;
                uVar15 = uVar15 + 1;
              } while (uVar18 != uVar15);
            }
          }
          fjac[iVar14] = local_60[(long)pdVar13];
          qtf[(long)pdVar13] = pdVar7[(long)pdVar13];
          pdVar13 = (double *)((long)pdVar13 + 1);
          pdVar11 = pdVar11 + (long)pdVar9 + 1;
          pdVar6 = pdVar6 + 1;
          uVar18 = uVar18 - 1;
        } while (pdVar13 != local_48);
      }
      dVar25 = 0.0;
      pdVar7 = local_58;
      if (dVar19 != 0.0 && 0 < (int)local_40) {
        lVar17 = 1;
        pdVar12 = (double *)0x0;
        pdVar6 = local_48;
        pdVar11 = fjac;
        do {
          dVar24 = pdVar7[ipvt[(long)pdVar12]];
          if ((dVar24 != 0.0) || (NAN(dVar24))) {
            dVar23 = 0.0;
            lVar10 = 0;
            pdVar7 = pdVar11;
            do {
              dVar23 = dVar23 + (qtf[lVar10] / dVar19) * *pdVar7;
              lVar10 = lVar10 + 1;
              pdVar7 = pdVar7 + (long)pdVar9;
            } while (lVar17 != lVar10);
            dVar25 = pmax(dVar25,ABS(dVar23 / dVar24));
            pdVar7 = local_58;
            pdVar6 = local_48;
          }
          pdVar12 = (double *)((long)pdVar12 + 1);
          lVar17 = lVar17 + 1;
          pdVar11 = pdVar11 + 1;
        } while (pdVar12 != pdVar6);
      }
      if (dVar25 <= gtol) {
        uVar16 = 4;
        break;
      }
      if (local_31 == '\0') {
        pdVar6 = (double *)0x0;
        do {
          dVar24 = pmax(diag[(long)pdVar6],pdVar7[(long)pdVar6]);
          diag[(long)pdVar6] = dVar24;
          pdVar6 = (double *)((long)pdVar6 + 1);
        } while (local_48 != pdVar6);
      }
      dVar24 = 0.0;
      pdVar7 = local_80;
      do {
        pdVar6 = local_58;
        if (0.0001 <= dVar24) {
          uVar16 = 0;
          break;
        }
        in_stack_fffffffffffffe48 = &local_98;
        iVar14 = (int)local_40;
        lmpar(fjac,(int)pdVar13,iVar14,ipvt,diag,qtf,local_50,in_stack_fffffffffffffe48,local_60,
              local_58);
        if (0 < iVar14) {
          pdVar7 = (double *)0x0;
          do {
            dVar24 = local_60[(long)pdVar7];
            dVar23 = -dVar24;
            local_60[(long)pdVar7] = dVar23;
            pdVar6[(long)pdVar7] = local_80[(long)pdVar7] - dVar24;
            x_00[(long)pdVar7] = diag[(long)pdVar7] * dVar23;
            pdVar7 = (double *)((long)pdVar7 + 1);
          } while (local_48 != pdVar7);
        }
        dVar23 = enorm(x_00,(int)local_40);
        uVar16 = local_64;
        if (local_68 == 1) {
          local_50 = pmin(local_50,dVar23);
        }
        pdVar7 = local_88;
        iVar14 = (int)local_40;
        (*funcmult->funcmult)(local_58,uVar16,iVar14,local_88,funcmult->params);
        *nfev = *nfev + 1;
        dVar20 = enorm(pdVar7,uVar16);
        if (0 < iVar14) {
          lVar17 = 1;
          pdVar6 = (double *)0x0;
          pdVar7 = fjac;
          do {
            x_00[(long)pdVar6] = 0.0;
            local_78 = local_60[ipvt[(long)pdVar6]];
            uStack_70 = 0;
            lVar10 = 0;
            pdVar13 = pdVar7;
            do {
              x_00[lVar10] = *pdVar13 * local_78 + x_00[lVar10];
              lVar10 = lVar10 + 1;
              pdVar13 = pdVar13 + (long)pdVar9;
            } while (lVar17 != lVar10);
            pdVar6 = (double *)((long)pdVar6 + 1);
            lVar17 = lVar17 + 1;
            pdVar7 = pdVar7 + 1;
          } while (pdVar6 != local_48);
        }
        dVar24 = enorm(x_00,(int)local_40);
        dVar3 = local_98;
        if (local_98 < 0.0) {
          dVar21 = sqrt(local_98);
        }
        else {
          dVar21 = SQRT(local_98);
        }
        pdVar7 = local_80;
        dVar27 = 1.0 - (dVar20 / dVar19) * (dVar20 / dVar19);
        uVar18 = -(ulong)(dVar20 * 0.1 < dVar19);
        dVar2 = (double)(~uVar18 & 0xbff0000000000000 | uVar18 & (ulong)dVar27);
        dVar21 = (dVar21 * dVar23) / dVar19;
        dVar21 = dVar21 * dVar21;
        dVar28 = (dVar24 / dVar19) * (dVar24 / dVar19);
        dVar26 = dVar21 + dVar21 + dVar28;
        dVar24 = (double)(-(ulong)(dVar26 != 0.0) & (ulong)(dVar2 / dVar26));
        if (dVar24 <= 0.25) {
          dVar28 = dVar28 + dVar21;
          dVar21 = (double)(~-(ulong)(dVar2 < 0.0) &
                            (~-(ulong)(dVar2 < 0.0) & 0x3fe0000000000000 |
                            (ulong)local_78 & -(ulong)(dVar2 < 0.0)) |
                           (ulong)((dVar28 * -0.5) / (dVar2 * 0.5 - dVar28)) & -(ulong)(dVar2 < 0.0)
                           );
          local_78 = 0.1;
          if (dVar20 * 0.1 < dVar19 && 0.1 <= dVar21) {
            local_78 = dVar21;
          }
          uStack_70 = 0;
          local_50 = pmin(local_50,dVar23 / 0.1);
          local_50 = local_50 * local_78;
          local_98 = dVar3 / local_78;
        }
        else if (((dVar3 == 0.0) && (!NAN(dVar3))) || (0.75 <= dVar24)) {
          local_50 = dVar23 + dVar23;
          local_98 = dVar3 * 0.5;
        }
        if (0.0001 <= dVar24) {
          if (0 < (int)local_40) {
            pdVar6 = (double *)0x0;
            do {
              dVar19 = local_58[(long)pdVar6];
              pdVar7[(long)pdVar6] = dVar19;
              local_58[(long)pdVar6] = dVar19 * diag[(long)pdVar6];
              pdVar6 = (double *)((long)pdVar6 + 1);
            } while (local_48 != pdVar6);
          }
          if (0 < (int)uVar16) {
            memcpy(fvec,local_88,sVar1);
          }
          par = enorm(local_58,(int)local_40);
          local_68 = local_68 + 1;
          dVar19 = dVar20;
        }
        dVar20 = (double)(~uVar18 & 0x3ff0000000000000 | (ulong)ABS(dVar27) & uVar18);
        bVar22 = -(ftol < dVar26) | -(ftol < dVar20);
        dVar23 = dVar24 * 0.5;
        uVar8 = (uint)(~bVar22 & dVar23 <= 1.0);
        uVar16 = uVar8;
        if (local_50 <= par * xtol) {
          uVar8 = 2;
          uVar16 = dVar23 <= 1.0 | 2;
        }
        if ((bVar22 & 1) != 0) {
          uVar16 = uVar8;
        }
        if (uVar16 != 0) break;
        pdVar13 = (double *)(ulong)(uint)maxfev;
        uVar8 = (uint)(maxfev <= *nfev) * 5;
        uVar16 = 6;
        if (1.0 < dVar23) {
          uVar16 = uVar8;
        }
        if (eps < dVar26) {
          uVar16 = uVar8;
        }
        if (eps < dVar20) {
          uVar16 = uVar8;
        }
        if (local_50 <= par * eps) {
          uVar16 = 7;
        }
        if (dVar25 <= eps) {
          uVar16 = 8;
        }
      } while (uVar16 == 0);
    } while (uVar16 == 0);
    free(local_60);
    free(local_58);
    free(x_00);
    free(local_88);
  }
  return uVar16;
}

Assistant:

int lmder(custom_funcmult *funcmult, custom_jacobian *jacobian, double *x, int M, int N,
		double *fvec,double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
		double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }
    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	JACOBIAN_EVAL(jacobian,x,M,N,fjac);
    	*njev = *njev +1;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}